

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkBlendFactor __thiscall
Diligent::BlendFactorToVkBlendFactorMapper::operator[]
          (BlendFactorToVkBlendFactorMapper *this,BLEND_FACTOR bf)

{
  Char *Message;
  const_reference pvVar1;
  char (*in_RCX) [61];
  undefined1 local_38 [8];
  string msg;
  BLEND_FACTOR bf_local;
  BlendFactorToVkBlendFactorMapper *this_local;
  
  msg.field_2._M_local_buf[0xf] = bf;
  if (((char)bf < '\x01') || ('\x11' < (char)bf)) {
    FormatString<char[26],char[61]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf > BLEND_FACTOR_UNDEFINED && bf < BLEND_FACTOR_NUM_FACTORS",in_RCX)
    ;
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x359);
    std::__cxx11::string::~string((string *)local_38);
  }
  pvVar1 = std::array<VkBlendFactor,_18UL>::operator[]
                     (&this->m_Map,(long)(int)msg.field_2._M_local_buf[0xf]);
  return *pvVar1;
}

Assistant:

VkBlendFactor operator[](BLEND_FACTOR bf) const
    {
        VERIFY_EXPR(bf > BLEND_FACTOR_UNDEFINED && bf < BLEND_FACTOR_NUM_FACTORS);
        return m_Map[static_cast<int>(bf)];
    }